

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPolyn.c
# Opt level: O2

void Pln_ManPrintFinal(Pln_Man_t *p,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar8;
  uint i;
  int iVar9;
  
  p_00 = Vec_IntAlloc(100);
  for (iVar9 = 0; iVar9 < p->vCoefs->nSize; iVar9 = iVar9 + 1) {
    iVar3 = Vec_IntEntry(p->vCoefs,iVar9);
    if (iVar3 != 0) {
      pVVar8 = Hsh_VecReadEntry(p->pHashC,iVar3);
      iVar5 = 0;
      iVar4 = Vec_IntEntry(pVVar8,0);
      Vec_IntPush(p_00,iVar4);
      pVVar8 = Hsh_VecReadEntry(p->pHashM,iVar9);
      if (pVVar8->nSize != 0) {
        iVar5 = Vec_IntEntry(pVVar8,0);
      }
      Vec_IntPush(p_00,iVar5);
      Vec_IntPush(p_00,iVar3);
      Vec_IntPush(p_00,iVar9);
    }
  }
  iVar9 = p_00->nSize;
  uVar6 = iVar9 / 4;
  qsort(p_00->pArray,(long)(int)uVar6,0x10,Pln_ManCompare3);
  if (fVerbose != 0) {
    for (i = 0; (int)(i | 1) < iVar9; i = i + 2) {
      iVar3 = Vec_IntEntry(p_00,i);
      iVar4 = Vec_IntEntry(p_00,i | 1);
      if ((i & 2) != 0) {
        printf("%-6d : ",(ulong)(i >> 2));
        pVVar8 = Hsh_VecReadEntry(p->pHashC,iVar3);
        for (iVar3 = 0; iVar3 < pVVar8->nSize; iVar3 = iVar3 + 1) {
          iVar5 = Vec_IntEntry(pVVar8,iVar3);
          pcVar2 = "3jF j3&F Tj#3F &3sF 3(#F &3+F 3BF#( +a&3F 3F.#( +8&3F #(F.B3 8a&+3F 3FK#( +";
          if (iVar5 < 0) {
            pcVar2 = "R,D tc;-R R5t* -Rt> t5*RD c>Rt- t;R,M t-RM; t;V,R V-tR; t5*lR l-t>R t5VR* -";
          }
          iVar1 = -iVar5;
          if (0 < iVar5) {
            iVar1 = iVar5;
          }
          printf("%s%d",pcVar2 + 0x4a,(ulong)(uint)(1 << ((char)iVar1 - 1U & 0x1f)));
        }
        pVVar8 = Hsh_VecReadEntry(p->pHashM,iVar4);
        for (iVar3 = 0; iVar3 < pVVar8->nSize; iVar3 = iVar3 + 1) {
          uVar7 = Vec_IntEntry(pVVar8,iVar3);
          printf(" * %d",(ulong)uVar7);
        }
        putchar(10);
      }
    }
  }
  printf("HashC = %d. HashM = %d.  Total = %d. Used = %d.  ",(ulong)(uint)p->pHashC->vMap->nSize,
         (ulong)(uint)p->pHashM->vMap->nSize,(ulong)(uint)p->nBuilds,(ulong)uVar6);
  Vec_IntFree(p_00);
  return;
}

Assistant:

void Pln_ManPrintFinal( Pln_Man_t * p, int fVerbose, int fVeryVerbose )
{
    Vec_Int_t * vArray;
    int i, k, Entry, iMono, iConst;
    // collect triples
    Vec_Int_t * vPairs = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( p->vCoefs, iConst, iMono )
    {
        if ( iConst == 0 ) 
            continue;
        vArray = Hsh_VecReadEntry( p->pHashC, iConst );
        Vec_IntPush( vPairs, Vec_IntEntry(vArray, 0) );
        vArray = Hsh_VecReadEntry( p->pHashM, iMono );
        Vec_IntPush( vPairs, Vec_IntSize(vArray) ? Vec_IntEntry(vArray, 0) : 0 );
        Vec_IntPushTwo( vPairs, iConst, iMono );
    }
    // sort triples
    qsort( Vec_IntArray(vPairs), (size_t)(Vec_IntSize(vPairs)/4), 16, (int (*)(const void *, const void *))Pln_ManCompare3 );
    // print
    if ( fVerbose )
    Vec_IntForEachEntryDouble( vPairs, iConst, iMono, i )
    {
        if ( i % 4 == 0 )
            continue;
        printf( "%-6d : ", i/4 );
        vArray = Hsh_VecReadEntry( p->pHashC, iConst );
        Vec_IntForEachEntry( vArray, Entry, k )
            printf( "%s%d", Entry < 0 ? "-" : "+", (1 << (Abc_AbsInt(Entry)-1)) );
        vArray = Hsh_VecReadEntry( p->pHashM, iMono );
        Vec_IntForEachEntry( vArray, Entry, k )
            printf( " * %d", Entry );
        printf( "\n" );
    }
    printf( "HashC = %d. HashM = %d.  Total = %d. Used = %d.  ", Hsh_VecSize(p->pHashC), Hsh_VecSize(p->pHashM), p->nBuilds, Vec_IntSize(vPairs)/4 );
    Vec_IntFree( vPairs );
}